

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  Fad<double> *pFVar9;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar10;
  uint uVar11;
  ulong uVar12;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar13;
  value_type vVar14;
  
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar10 = (pFVar13->fadexpr_).left_;
  pFVar9 = (pFVar10->fadexpr_).left_;
  uVar11 = (pFVar9->dx_).num_elts;
  uVar1 = (((pFVar10->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar11) {
    uVar1 = uVar11;
  }
  uVar2 = (((pFVar13->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00de7ad9;
    pdVar8 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00de7ad9;
    }
    if (uVar2 != 0) {
      pdVar8 = (this->dx_).ptr_to_data;
      if (pdVar8 != (double *)0x0) {
        operator_delete__(pdVar8);
        pFVar13 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar12 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar12 = (ulong)uVar1 << 3;
    }
    pdVar8 = (double *)operator_new__(uVar12);
    (this->dx_).ptr_to_data = pdVar8;
    pFVar10 = (pFVar13->fadexpr_).left_;
    pFVar9 = (pFVar10->fadexpr_).left_;
    uVar11 = (pFVar9->dx_).num_elts;
  }
  if (((uVar11 == 0) || (pFVar3 = (pFVar10->fadexpr_).right_, (pFVar3->dx_).num_elts == 0)) ||
     (pFVar4 = (pFVar13->fadexpr_).right_, (pFVar4->dx_).num_elts == 0)) {
    if (0 < (int)uVar1) {
      uVar12 = 0;
      do {
        vVar14 = FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>
                 ::dx(&fadexpr->fadexpr_,(int)uVar12);
        pdVar8[uVar12] = vVar14;
        uVar12 = uVar12 + 1;
      } while (uVar1 != uVar12);
    }
  }
  else if (0 < (int)uVar1) {
    pdVar5 = *(double **)((long)&pFVar9->dx_ + 8);
    pdVar6 = (pFVar3->dx_).ptr_to_data;
    pdVar7 = (pFVar4->dx_).ptr_to_data;
    uVar12 = 0;
    do {
      pdVar8[uVar12] =
           (pdVar5[uVar12] + pdVar6[uVar12] + pdVar7[uVar12]) / (fadexpr->fadexpr_).right_.constant_
      ;
      uVar12 = uVar12 + 1;
    } while (uVar1 != uVar12);
  }
LAB_00de7ad9:
  pFVar13 = (fadexpr->fadexpr_).left_;
  pFVar10 = (pFVar13->fadexpr_).left_;
  this->val_ = (((pFVar10->fadexpr_).left_)->val_ + ((pFVar10->fadexpr_).right_)->val_ +
               ((pFVar13->fadexpr_).right_)->val_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}